

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::runtime::basic_param>::
shared_ptr<boost::runtime::parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0,true>>
          (shared_ptr<boost::runtime::basic_param> *this,
          parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0,_true> *p)

{
  this->px = &p->super_basic_param;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::
  sp_pointer_construct<boost::runtime::basic_param,boost::runtime::parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0,true>>
            (this,p,&this->pn);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }